

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

bool __thiscall
embree::SceneGraph::GroupNode::calculateClosed(GroupNode *this,bool group_instancing)

{
  bool *pbVar1;
  pointer pRVar2;
  byte bVar3;
  int iVar4;
  Ref<embree::SceneGraph::Node> *c;
  pointer pRVar5;
  
  bVar3 = 1;
  if ((this->super_Node).closed == false) {
    (this->super_Node).closed = group_instancing;
    (this->super_Node).hasLightOrCamera = false;
    pRVar2 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = group_instancing;
    for (pRVar5 = (this->children).
                  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1)
    {
      iVar4 = (*(pRVar5->ptr->super_RefCount)._vptr_RefCount[7])
                        (pRVar5->ptr,(ulong)group_instancing);
      bVar3 = (byte)iVar4 & (this->super_Node).closed;
      (this->super_Node).closed = (bool)bVar3;
      pbVar1 = &(this->super_Node).hasLightOrCamera;
      *pbVar1 = (bool)(*pbVar1 | pRVar5->ptr->hasLightOrCamera);
    }
  }
  return (bool)((this->super_Node).indegree == 1 & bVar3);
}

Assistant:

bool SceneGraph::GroupNode::calculateClosed(bool group_instancing)
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      hasLightOrCamera = false;
      for (auto& c : children) {
        closed &= c->calculateClosed(group_instancing);
        hasLightOrCamera |= c->hasLightOrCamera;
      }
    }
    return closed && (indegree == 1);
  }